

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  char cVar6;
  CURLUcode CVar7;
  CURLcode CVar8;
  CURLUcode CVar9;
  size_t sVar10;
  int *piVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  size_t sVar15;
  Curl_handler *pCVar16;
  char *pcVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  size_t buflen;
  CURLU *pCVar21;
  bool bVar22;
  char *oldurl;
  char *decoded;
  char *redired_url;
  uint local_94;
  CURLU *local_90;
  dynbuf local_80;
  uint local_5c;
  char *local_58;
  dynbuf local_50;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      pCVar21 = (CURLU *)0x0;
      break;
    case CURLUPART_SCHEME:
      u->field_0x52 = u->field_0x52 & 0xfb;
      pCVar21 = u;
      break;
    case CURLUPART_USER:
      pCVar21 = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      pCVar21 = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      pCVar21 = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      pCVar21 = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      pCVar21 = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      pCVar21 = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      u->field_0x52 = u->field_0x52 & 0xfe;
      pCVar21 = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      u->field_0x52 = u->field_0x52 & 0xfd;
      pCVar21 = (CURLU *)&u->fragment;
      break;
    case CURLUPART_ZONEID:
      pCVar21 = (CURLU *)&u->zoneid;
      break;
    default:
      goto switchD_001650bb_default;
    }
    if (pCVar21 == (CURLU *)0x0) {
      free_urlhandle(u);
      u->query = (char *)0x0;
      u->fragment = (char *)0x0;
      u->port = (char *)0x0;
      u->path = (char *)0x0;
      u->host = (char *)0x0;
      u->zoneid = (char *)0x0;
      u->password = (char *)0x0;
      u->options = (char *)0x0;
      u->scheme = (char *)0x0;
      u->user = (char *)0x0;
      *(undefined8 *)&u->portnum = 0;
      return CURLUE_OK;
    }
    if (pCVar21->scheme != (char *)0x0) {
      (*Curl_cfree)(pCVar21->scheme);
      pCVar21->scheme = (char *)0x0;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  sVar10 = strlen(part);
  CVar7 = CURLUE_MALFORMED_INPUT;
  if (8000000 < sVar10) {
    return CURLUE_MALFORMED_INPUT;
  }
  if (CURLUPART_ZONEID < what) {
switchD_001650bb_default:
    return CURLUE_UNKNOWN_PART;
  }
  bVar5 = (byte)flags >> 7;
  switch(what) {
  case CURLUPART_URL:
    if (sVar10 == 0) {
      return CURLUE_MALFORMED_INPUT;
    }
    sVar15 = Curl_is_absolute_url(part,(char *)0x0,buflen,(flags & 0x204) != 0);
    if ((sVar15 != 0) ||
       (CVar7 = curl_url_get(u,CURLUPART_URL,&local_80.bufr,flags), CVar7 != CURLUE_OK)) {
      CVar7 = parseurl_and_replace(part,u,flags);
      return CVar7;
    }
    CVar8 = concat_url(local_80.bufr,part,&local_50.bufr);
    (*Curl_cfree)(local_80.bufr);
    if (CVar8 == CURLE_OK) {
      pcVar14 = (char *)CONCAT53(local_50.bufr._3_5_,
                                 CONCAT12(local_50.bufr._2_1_,
                                          CONCAT11(local_50.bufr._1_1_,local_50.bufr._0_1_)));
      CVar7 = parseurl_and_replace(pcVar14,u,flags);
      (*Curl_cfree)(pcVar14);
      return CVar7;
    }
    if (CVar8 == CURLE_TOO_LARGE) {
      return CURLUE_TOO_LARGE;
    }
    return CURLUE_OUT_OF_MEMORY;
  case CURLUPART_SCHEME:
    CVar7 = CURLUE_BAD_SCHEME;
    if (sVar10 - 0x29 < 0xffffffffffffffd8) {
LAB_001651c2:
      bVar22 = false;
      local_90 = (CURLU *)0x0;
    }
    else {
      if (((flags & 8) == 0) &&
         (pCVar16 = Curl_get_scheme_handler(part), pCVar16 == (Curl_handler *)0x0)) {
        CVar7 = CURLUE_UNSUPPORTED_SCHEME;
        goto LAB_001651c2;
      }
      local_90 = u;
      if ((byte)((*part & 0xdfU) + 0xbf) < 0x1a) {
        if (sVar10 != 1) {
          lVar13 = 0;
          do {
            bVar5 = part[lVar13];
            if (((9 < (byte)(bVar5 - 0x30)) && (0x19 < (byte)((bVar5 & 0xdf) + 0xbf))) &&
               ((0x2e < bVar5 || ((0x680000000000U >> ((ulong)bVar5 & 0x3f) & 1) == 0))))
            goto LAB_0016571b;
            lVar13 = lVar13 + 1;
          } while (sVar10 - 1 != lVar13);
        }
        u->field_0x52 = u->field_0x52 & 0xfb;
        bVar22 = true;
        bVar5 = 0;
      }
      else {
LAB_0016571b:
        bVar22 = false;
        bVar5 = 0;
      }
    }
    if (!bVar22) {
      return CVar7;
    }
    bVar22 = true;
    local_94 = 0;
    uVar18 = 0;
    goto LAB_001652a2;
  case CURLUPART_USER:
    local_90 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    local_90 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    local_90 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    local_90 = (CURLU *)&u->host;
    (*Curl_cfree)(u->zoneid);
    u->zoneid = (char *)0x0;
    break;
  case CURLUPART_PORT:
    if (9 < (byte)(*part - 0x30U)) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    piVar11 = __errno_location();
    *piVar11 = 0;
    uVar12 = strtoul(part,&local_80.bufr,10);
    if (0xffff < uVar12 || *piVar11 != 0) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*local_80.bufr != '\0') {
      return CURLUE_BAD_PORT_NUMBER;
    }
    pcVar14 = (*Curl_cstrdup)(part);
    if (pcVar14 != (char *)0x0) {
      (*Curl_cfree)(u->port);
      u->port = pcVar14;
      u->portnum = (unsigned_short)uVar12;
      return CURLUE_OK;
    }
    return CURLUE_OUT_OF_MEMORY;
  case CURLUPART_PATH:
    local_90 = (CURLU *)&u->path;
    uVar18 = 0x17db01;
    local_94 = 0;
    bVar22 = true;
    goto LAB_001652a2;
  case CURLUPART_QUERY:
    bVar22 = -1 < (char)(byte)flags;
    local_94 = flags >> 8;
    local_90 = (CURLU *)&u->query;
    u->field_0x52 = u->field_0x52 | 1;
    goto LAB_001652a0;
  case CURLUPART_FRAGMENT:
    u->field_0x52 = u->field_0x52 | 2;
    local_90 = (CURLU *)&u->fragment;
    break;
  case CURLUPART_ZONEID:
    local_90 = (CURLU *)&u->zoneid;
  }
  bVar22 = true;
  local_94 = 0;
LAB_001652a0:
  uVar18 = 0;
LAB_001652a2:
  local_5c = uVar18;
  Curl_dyn_init(&local_80,(ulong)(uVar18 & 0xff) + sVar10 * 3 + 1);
  if (((char)uVar18 != '\0') && (*part != '/')) {
    CVar8 = Curl_dyn_addn(&local_80,"/",1);
    CVar9 = CURLUE_OUT_OF_MEMORY;
    if (CVar8 == CURLE_TOO_LARGE) {
      CVar9 = CURLUE_TOO_LARGE;
    }
    if (CVar8 != CURLE_OK) {
      return CVar9;
    }
  }
  if (bVar5 == 0) {
    CVar8 = Curl_dyn_add(&local_80,part);
    if (CVar8 == CURLE_OK) {
      pcVar14 = Curl_dyn_ptr(&local_80);
      do {
        lVar13 = 1;
        if (*pcVar14 == '%') {
          bVar2 = pcVar14[1];
          if (((((byte)(bVar2 - 0x30) < 10) ||
               ((bVar2 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0)
                ))) && ((bVar3 = pcVar14[2], (byte)(bVar3 - 0x30) < 10 ||
                        ((bVar3 - 0x41 < 0x26 &&
                         ((0x3f0000003fU >> ((ulong)(bVar3 - 0x41) & 0x3f) & 1) != 0)))))) &&
             ((byte)(bVar2 + 0xbf) < 0x1a || (byte)(bVar3 + 0xbf) < 0x1a)) {
            cVar6 = Curl_raw_tolower(bVar2);
            pcVar14[1] = cVar6;
            cVar6 = Curl_raw_tolower(pcVar14[2]);
            pcVar14[2] = cVar6;
            lVar13 = 3;
          }
        }
        else if (*pcVar14 == '\0') goto LAB_0016554d;
        pcVar14 = pcVar14 + lVar13;
      } while( true );
    }
    CVar7 = CURLUE_OUT_OF_MEMORY;
    if (CVar8 == CURLE_TOO_LARGE) {
      CVar7 = CURLUE_TOO_LARGE;
    }
LAB_0016554d:
    if (CVar8 != CURLE_OK) {
      return CVar7;
    }
  }
  else {
    bVar2 = *part;
    uVar18 = local_94;
    while (bVar2 != 0) {
      if (bVar2 == 0x20 && !bVar22) {
        CVar8 = Curl_dyn_addn(&local_80,"+",1);
        if (CVar8 != CURLE_OK) {
          CVar9 = CURLUE_OUT_OF_MEMORY;
          goto LAB_001653b5;
        }
LAB_0016540e:
        bVar4 = true;
      }
      else {
        if ((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) {
          uVar19 = (uint)bVar2;
          if (bVar2 < 0x3d) {
            if ((1 < bVar2 - 0x2d) && ((bVar2 != 0x2f || ((char)local_5c == '\0'))))
            goto LAB_001653bf;
          }
          else if (bVar2 == 0x3d) {
            if ((uVar18 & 1) == 0) goto LAB_001653bf;
          }
          else if ((uVar19 != 0x5f) && (uVar19 != 0x7e)) {
LAB_001653bf:
            local_50.bufr._0_1_ = 0x25;
            local_50.bufr._1_1_ = "0123456789abcdef"[bVar2 >> 4];
            local_50.bufr._2_1_ = "0123456789abcdef"[uVar19 & 0xf];
            CVar8 = Curl_dyn_addn(&local_80,&local_50,3);
            CVar9 = CURLUE_OUT_OF_MEMORY;
            if (CVar8 == CURLE_TOO_LARGE) {
              CVar9 = CURLUE_TOO_LARGE;
            }
            if (CVar8 != CURLE_OK) goto LAB_001653b5;
            goto LAB_0016540e;
          }
        }
        uVar20 = uVar18 & 0xff;
        uVar19 = uVar20;
        if ((uVar18 & 1) != 0) {
          uVar19 = 0;
        }
        uVar18 = uVar19;
        if (bVar2 != 0x3d) {
          uVar18 = uVar20;
        }
        CVar8 = Curl_dyn_addn(&local_80,part,1);
        if (CVar8 == CURLE_OK) goto LAB_0016540e;
        CVar9 = CURLUE_OUT_OF_MEMORY;
        if (CVar8 == CURLE_TOO_LARGE) {
          CVar9 = CURLUE_TOO_LARGE;
        }
LAB_001653b5:
        CVar7 = CVar9;
        bVar4 = false;
      }
      if (!bVar4) break;
      pbVar1 = (byte *)(part + 1);
      part = part + 1;
      bVar2 = *pbVar1;
    }
    if (bVar2 != 0) {
      return CVar7;
    }
  }
  pcVar14 = Curl_dyn_ptr(&local_80);
  if (((byte)local_94 & pcVar14 != (char *)0x0) == 1) {
    pcVar17 = u->query;
    if (pcVar17 == (char *)0x0) {
      sVar10 = 0;
    }
    else {
      sVar10 = strlen(pcVar17);
    }
    if (sVar10 != 0) {
      cVar6 = pcVar17[sVar10 - 1];
      Curl_dyn_init(&local_50,8000000);
      CVar8 = Curl_dyn_addn(&local_50,u->query,sVar10);
      if ((CVar8 == CURLE_OK) &&
         (((cVar6 == '&' || (CVar8 = Curl_dyn_addn(&local_50,"&",1), CVar8 == CURLE_OK)) &&
          (CVar8 = Curl_dyn_add(&local_50,pcVar14), CVar8 == CURLE_OK)))) {
        Curl_dyn_free(&local_80);
        (*Curl_cfree)(local_90->scheme);
        pcVar17 = Curl_dyn_ptr(&local_50);
        local_90->scheme = pcVar17;
        CVar7 = CURLUE_OK;
      }
      else {
        Curl_dyn_free(&local_80);
        CVar7 = CURLUE_OUT_OF_MEMORY;
      }
    }
    if (sVar10 != 0) {
      return CVar7;
    }
  }
  else if (what == CURLUPART_HOST) {
    sVar15 = Curl_dyn_len(&local_80);
    bVar22 = true;
    if (((byte)(flags >> 10) & sVar15 == 0) == 0) {
      if (sVar15 == 0) {
        bVar22 = true;
      }
      else if (bVar5 == 0) {
        local_58 = (char *)0x0;
        CVar8 = Curl_urldecode(pcVar14,sVar15,&local_58,(size_t *)&local_50,REJECT_CTRL);
        if ((CVar8 == CURLE_OK) &&
           (CVar9 = hostname_check(u,local_58,
                                   CONCAT53(local_50.bufr._3_5_,
                                            CONCAT12(local_50.bufr._2_1_,
                                                     CONCAT11(local_50.bufr._1_1_,
                                                              local_50.bufr._0_1_)))),
           CVar9 == CURLUE_OK)) {
          bVar22 = false;
        }
        else {
          bVar22 = true;
        }
        (*Curl_cfree)(local_58);
      }
      else {
        CVar9 = hostname_check(u,pcVar14,sVar15);
        bVar22 = CVar9 != CURLUE_OK;
      }
      if (bVar22) {
        Curl_dyn_free(&local_80);
        CVar7 = CURLUE_BAD_HOSTNAME;
      }
      bVar22 = (bool)(bVar22 ^ 1);
    }
    if (!bVar22) {
      return CVar7;
    }
  }
  (*Curl_cfree)(local_90->scheme);
  local_90->scheme = pcVar14;
  return CURLUE_OK;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool leadingslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;
  size_t nalloc;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      u->guessed_scheme = FALSE;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      u->query_present = FALSE;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      u->fragment_present = FALSE;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      Curl_safefree(*storep);
    }
    else if(!storep) {
      free_urlhandle(u);
      memset(u, 0, sizeof(struct Curl_URL));
    }
    return CURLUE_OK;
  }

  nalloc = strlen(part);
  if(nalloc > CURL_MAX_INPUT_LENGTH)
    /* excessive input length */
    return CURLUE_MALFORMED_INPUT;

  switch(what) {
  case CURLUPART_SCHEME: {
    size_t plen = strlen(part);
    const char *s = part;
    if((plen > MAX_SCHEME_LEN) || (plen < 1))
      /* too long or too short */
      return CURLUE_BAD_SCHEME;
   /* verify that it is a fine scheme */
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) && !Curl_get_scheme_handler(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    if(ISALPHA(*s)) {
      /* ALPHA *( ALPHA / DIGIT / "+" / "-" / "." ) */
      while(--plen) {
        if(ISALNUM(*s) || (*s == '+') || (*s == '-') || (*s == '.'))
          s++; /* fine */
        else
          return CURLUE_BAD_SCHEME;
      }
    }
    else
      return CURLUE_BAD_SCHEME;
    u->guessed_scheme = FALSE;
    break;
  }
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    Curl_safefree(u->zoneid);
    break;
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
    if(!ISDIGIT(part[0]))
      /* not a number */
      return CURLUE_BAD_PORT_NUMBER;
    else {
      char *tmp;
      char *endp;
      unsigned long port;
      errno = 0;
      port = strtoul(part, &endp, 10);  /* must be decimal */
      if(errno || (port > 0xffff) || *endp)
        /* weirdly provided number, not good! */
        return CURLUE_BAD_PORT_NUMBER;
      tmp = strdup(part);
      if(!tmp)
        return CURLUE_OUT_OF_MEMORY;
      free(u->port);
      u->port = tmp;
      u->portnum = (unsigned short)port;
      return CURLUE_OK;
    }
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    leadingslash = TRUE; /* enforce */
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    equalsencode = appendquery;
    storep = &u->query;
    u->query_present = TRUE;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    u->fragment_present = TRUE;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLcode result;
    CURLUcode uc;
    char *oldurl;
    char *redired_url;

    if(!nalloc)
      /* a blank URL is not a valid URL */
      return CURLUE_MALFORMED_INPUT;

    /* if the new thing is absolute or the old one is not
     * (we could not get an absolute URL in 'oldurl'),
     * then replace the existing with the new. */
    if(Curl_is_absolute_url(part, NULL, 0,
                            flags & (CURLU_GUESS_SCHEME|
                                     CURLU_DEFAULT_SCHEME))
       || curl_url_get(u, CURLUPART_URL, &oldurl, flags)) {
      return parseurl_and_replace(part, u, flags);
    }

    /* apply the relative part to create a new URL
     * and replace the existing one with it. */
    result = concat_url(oldurl, part, &redired_url);
    free(oldurl);
    if(result)
      return cc2cu(result);

    uc = parseurl_and_replace(redired_url, u, flags);
    free(redired_url);
    return uc;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  DEBUGASSERT(storep);
  {
    const char *newp;
    struct dynbuf enc;
    Curl_dyn_init(&enc, nalloc * 3 + 1 + leadingslash);

    if(leadingslash && (part[0] != '/')) {
      CURLcode result = Curl_dyn_addn(&enc, "/", 1);
      if(result)
        return cc2cu(result);
    }
    if(urlencode) {
      const unsigned char *i;

      for(i = (const unsigned char *)part; *i; i++) {
        CURLcode result;
        if((*i == ' ') && plusencode) {
          result = Curl_dyn_addn(&enc, "+", 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else if(ISUNRESERVED(*i) ||
                ((*i == '/') && urlskipslash) ||
                ((*i == '=') && equalsencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          result = Curl_dyn_addn(&enc, i, 1);
          if(result)
            return cc2cu(result);
        }
        else {
          char out[3]={'%'};
          out[1] = hexdigits[*i>>4];
          out[2] = hexdigits[*i & 0xf];
          result = Curl_dyn_addn(&enc, out, 3);
          if(result)
            return cc2cu(result);
        }
      }
    }
    else {
      char *p;
      CURLcode result = Curl_dyn_add(&enc, part);
      if(result)
        return cc2cu(result);
      p = Curl_dyn_ptr(&enc);
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = Curl_raw_tolower(p[1]);
          p[2] = Curl_raw_tolower(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }
    newp = Curl_dyn_ptr(&enc);

    if(appendquery && newp) {
      /* Append the 'newp' string onto the old query. Add a '&' separator if
         none is present at the end of the existing query already */

      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        struct dynbuf qbuf;
        Curl_dyn_init(&qbuf, CURL_MAX_INPUT_LENGTH);

        if(Curl_dyn_addn(&qbuf, u->query, querylen)) /* add original query */
          goto nomem;

        if(addamperand) {
          if(Curl_dyn_addn(&qbuf, "&", 1))
            goto nomem;
        }
        if(Curl_dyn_add(&qbuf, newp))
          goto nomem;
        Curl_dyn_free(&enc);
        free(*storep);
        *storep = Curl_dyn_ptr(&qbuf);
        return CURLUE_OK;
nomem:
        Curl_dyn_free(&enc);
        return CURLUE_OUT_OF_MEMORY;
      }
    }

    else if(what == CURLUPART_HOST) {
      size_t n = Curl_dyn_len(&enc);
      if(!n && (flags & CURLU_NO_AUTHORITY)) {
        /* Skip hostname check, it is allowed to be empty. */
      }
      else {
        bool bad = FALSE;
        if(!n)
          bad = TRUE; /* empty hostname is not okay */
        else if(!urlencode) {
          /* if the host name part was not URL encoded here, it was set ready
             URL encoded so we need to decode it to check */
          size_t dlen;
          char *decoded = NULL;
          CURLcode result =
            Curl_urldecode(newp, n, &decoded, &dlen, REJECT_CTRL);
          if(result || hostname_check(u, decoded, dlen))
            bad = TRUE;
          free(decoded);
        }
        else if(hostname_check(u, (char *)newp, n))
          bad = TRUE;
        if(bad) {
          Curl_dyn_free(&enc);
          return CURLUE_BAD_HOSTNAME;
        }
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  return CURLUE_OK;
}